

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O3

void __thiscall
duckdb::AggregateFunction::AggregateFunction
          (AggregateFunction *this,string *name,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,aggregate_size_t state_size,aggregate_initialize_t initialize,
          aggregate_update_t update,aggregate_combine_t combine,aggregate_finalize_t finalize,
          aggregate_simple_update_t simple_update,bind_aggregate_function_t bind,
          aggregate_destructor_t destructor,aggregate_statistics_t statistics,
          aggregate_window_t window,aggregate_serialize_t serialize,
          aggregate_deserialize_t deserialize)

{
  pointer pcVar1;
  LogicalType local_98;
  LogicalType local_80;
  vector<duckdb::LogicalType,_true> local_68;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,
             &arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  LogicalType::LogicalType(&local_80,return_type);
  LogicalType::LogicalType(&local_98,INVALID);
  BaseScalarFunction::BaseScalarFunction
            (&this->super_BaseScalarFunction,&local_50,&local_68,&local_80,CONSISTENT,&local_98,
             DEFAULT_NULL_HANDLING,CANNOT_ERROR);
  LogicalType::~LogicalType(&local_98);
  LogicalType::~LogicalType(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02435ff8;
  this->state_size = state_size;
  this->initialize = initialize;
  this->update = update;
  this->combine = combine;
  this->finalize = finalize;
  this->simple_update = simple_update;
  this->window = window;
  this->window_init = (aggregate_wininit_t)0x0;
  this->bind = bind;
  this->destructor = destructor;
  this->statistics = statistics;
  this->serialize = serialize;
  this->deserialize = deserialize;
  this->order_dependent = ORDER_DEPENDENT;
  this->distinct_dependent = DISTINCT_DEPENDENT;
  (this->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

AggregateFunction(const string &name, const vector<LogicalType> &arguments, const LogicalType &return_type,
	                  aggregate_size_t state_size, aggregate_initialize_t initialize, aggregate_update_t update,
	                  aggregate_combine_t combine, aggregate_finalize_t finalize,
	                  aggregate_simple_update_t simple_update = nullptr, bind_aggregate_function_t bind = nullptr,
	                  aggregate_destructor_t destructor = nullptr, aggregate_statistics_t statistics = nullptr,
	                  aggregate_window_t window = nullptr, aggregate_serialize_t serialize = nullptr,
	                  aggregate_deserialize_t deserialize = nullptr)
	    : BaseScalarFunction(name, arguments, return_type, FunctionStability::CONSISTENT,
	                         LogicalType(LogicalTypeId::INVALID)),
	      state_size(state_size), initialize(initialize), update(update), combine(combine), finalize(finalize),
	      simple_update(simple_update), window(window), bind(bind), destructor(destructor), statistics(statistics),
	      serialize(serialize), deserialize(deserialize), order_dependent(AggregateOrderDependent::ORDER_DEPENDENT),
	      distinct_dependent(AggregateDistinctDependent::DISTINCT_DEPENDENT) {
	}